

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

Status __thiscall
leveldb::anon_unknown_1::PosixRandomAccessFile::Read
          (PosixRandomAccessFile *this,uint64_t offset,size_t n,Slice *result,char *scratch)

{
  ssize_t sVar1;
  int *piVar2;
  _func_int **pp_Var3;
  void *in_R9;
  ssize_t sVar4;
  char *local_30;
  
  (this->super_RandomAccessFile)._vptr_RandomAccessFile = (_func_int **)0x0;
  sVar1 = pread(*(int *)(offset + 0x28),in_R9,(size_t)result,n);
  sVar4 = 0;
  if (0 < sVar1) {
    sVar4 = sVar1;
  }
  *(void **)scratch = in_R9;
  *(ssize_t *)(scratch + 8) = sVar4;
  if (sVar1 < 0) {
    piVar2 = __errno_location();
    IOError((anon_unknown_1 *)&local_30,(string *)(offset + 8),*piVar2);
    if (local_30 != (char *)0x0) {
      if (local_30 == (char *)0x0) {
        pp_Var3 = (_func_int **)0x0;
      }
      else {
        pp_Var3 = (_func_int **)Status::CopyState(local_30);
      }
      (this->super_RandomAccessFile)._vptr_RandomAccessFile = pp_Var3;
    }
    if (local_30 != (char *)0x0) {
      operator_delete__(local_30);
    }
  }
  return (Status)(char *)this;
}

Assistant:

virtual Status Read(uint64_t offset, size_t n, Slice *result,
                                char *scratch) const {
                Status s;
                ssize_t r = pread(fd_, scratch, n, static_cast<off_t>(offset));
                *result = Slice(scratch, (r < 0) ? 0 : r);
                if (r < 0) {
                    // An error: return a non-ok status
                    s = IOError(filename_, errno);
                }
                return s;
            }